

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O1

string * pbrt::anon_unknown_191::normalizeArg(string *__return_storage_ptr__,string *str)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar2 = str->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (str->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      bVar1 = pcVar3[sVar4];
      if ((bVar1 != 0x2d) && (bVar1 != 0x5f)) {
        tolower((uint)bVar1);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string normalizeArg(const std::string &str) {
    std::string ret;
    for (unsigned char c : str) {
        if (c != '_' && c != '-')
            ret += std::tolower(c);
    }
    return ret;
}